

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheDrop(PgHdr *p)

{
  PCache *pPVar1;
  
  if ((p->flags & 2) != 0) {
    pcacheManageDirtyList(p,'\x01');
  }
  pPVar1 = p->pCache;
  pPVar1->nRef = pPVar1->nRef + -1;
  if (p->pgno == 1) {
    pPVar1->pPage1 = (PgHdr *)0x0;
  }
  (*sqlite3Config.pcache2.xUnpin)(pPVar1->pCache,p->pPage,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheDrop(PgHdr *p){
  assert( p->nRef==1 );
  if( p->flags&PGHDR_DIRTY ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_REMOVE);
  }
  p->pCache->nRef--;
  if( p->pgno==1 ){
    p->pCache->pPage1 = 0;
  }
  sqlite3GlobalConfig.pcache2.xUnpin(p->pCache->pCache, p->pPage, 1);
}